

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_parallel.h
# Opt level: O0

void highwayhash::ThreadPool::RunRange(ThreadPool *self,WorkerCommand command)

{
  int *piVar1;
  int local_7c;
  int local_78;
  int i;
  int local_70;
  int local_6c;
  int my_end;
  int my_begin;
  int local_60;
  int local_5c;
  int my_size;
  int num_remaining;
  int num_reserved;
  int num_tasks;
  int end;
  int begin;
  WorkerCommand command_local;
  ThreadPool *self_local;
  memory_order local_30;
  int local_2c;
  memory_order __b;
  int local_20;
  int local_1c;
  undefined4 local_18;
  int local_14;
  int *local_10;
  
  num_remaining = (int)(command >> 0x20) - (int)command;
  _end = command;
  command_local = (WorkerCommand)self;
  while( true ) {
    num_reserved = (int)(command >> 0x20);
    num_tasks = (int)command;
    piVar1 = (int *)(command_local + 0x100);
    local_2c = 5;
    ___b = piVar1;
    local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_2c - 1U < 2) {
      self_local._4_4_ = *piVar1;
    }
    else if (local_2c == 5) {
      self_local._4_4_ = *piVar1;
    }
    else {
      self_local._4_4_ = *piVar1;
    }
    my_size = self_local._4_4_;
    local_5c = num_remaining - self_local._4_4_;
    my_begin = local_5c / (*(int *)command_local * 2);
    my_end = 1;
    piVar1 = std::max<int>(&my_begin,&my_end);
    local_60 = *piVar1;
    local_10 = (int *)(command_local + 0x100);
    local_18 = 5;
    LOCK();
    local_20 = *local_10;
    *local_10 = *local_10 + local_60;
    UNLOCK();
    local_6c = num_tasks + local_20;
    i = local_6c + local_60;
    local_78 = num_tasks + num_remaining;
    local_1c = local_60;
    local_14 = local_60;
    piVar1 = std::min<int>(&i,&local_78);
    local_70 = *piVar1;
    if (local_70 <= local_6c) break;
    for (local_7c = local_6c; command = CONCAT44(num_reserved,num_tasks), local_7c < local_70;
        local_7c = local_7c + 1) {
      std::function<void_(int)>::operator()((function<void_(int)> *)(command_local + 0xb8),local_7c)
      ;
    }
  }
  return;
}

Assistant:

static void RunRange(ThreadPool* self, const WorkerCommand command) {
    const int begin = command & 0xFFFFFFFF;
    const int end = command >> 32;
    const int num_tasks = end - begin;

    // OpenMP introduced several "schedule" strategies:
    // "single" (static assignment of exactly one chunk per thread): slower.
    // "dynamic" (allocates k tasks at a time): competitive for well-chosen k.
    // "guided" (allocates k tasks, decreases k): computing k = remaining/n
    //   is faster than halving k each iteration. We prefer this strategy
    //   because it avoids user-specified parameters.

    for (;;) {
      const int num_reserved = self->num_reserved_.load();
      const int num_remaining = num_tasks - num_reserved;
      const int my_size = std::max(num_remaining / (self->num_threads_ * 2), 1);
      const int my_begin = begin + self->num_reserved_.fetch_add(my_size);
      const int my_end = std::min(my_begin + my_size, begin + num_tasks);
      // Another thread already reserved the last task.
      if (my_begin >= my_end) {
        break;
      }
      for (int i = my_begin; i < my_end; ++i) {
        self->task_(i);
      }
    }
  }